

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O3

void __thiscall
cmDebugger::cmDebuggerVariables::EnumerateSubVariablesIfAny
          (cmDebuggerVariables *this,array<dap::Variable> *toBeReturned)

{
  pointer psVar1;
  element_type *peVar2;
  pointer pcVar3;
  pointer psVar4;
  bool bVar5;
  array<dap::Variable> ret;
  vector<dap::Variable,_std::allocator<dap::Variable>_> local_1a8;
  undefined1 local_190 [96];
  _Alloc_hider local_130;
  char local_120 [16];
  integer local_110;
  undefined8 uStack_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  bool local_e8;
  _Alloc_hider local_e0;
  char local_d0 [16];
  bool local_c0;
  optional<dap::boolean> local_b8;
  _Alloc_hider local_b0;
  char local_a0 [16];
  bool local_90;
  bool local_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined8 local_60;
  _Alloc_hider local_58;
  char local_48 [16];
  integer local_38;
  
  local_1a8.super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar4 = (this->SubVariables).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->SubVariables).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar1) {
    do {
      local_190._16_8_ = 0;
      local_190._24_8_ = 0;
      local_190._8_8_ = 0;
      local_190._32_8_ = 0;
      local_190._88_8_ = 0;
      local_190._80_8_ = 0;
      local_190._64_8_ = 0;
      local_190._40_8_ = 0;
      local_190._48_8_ = 0;
      local_190._56_8_ = local_190 + 0x48;
      local_190._72_8_ = 0;
      peVar2 = (psVar4->
               super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_130._M_p = local_120;
      pcVar3 = (peVar2->Name)._M_dataplus._M_p;
      local_190._0_8_ = local_190 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar3,pcVar3 + (peVar2->Name)._M_string_length);
      local_110.val = 0;
      uStack_108._0_1_ = false;
      uStack_108._1_7_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_100,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(anonymous_namespace)::PrivatePropertyHint);
      local_e8 = (bool)(anonymous_namespace)::PrivatePropertyHint[0x18];
      local_e0._M_p = local_d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,(anonymous_namespace)::PrivatePropertyHint._32_8_,
                 (anonymous_namespace)::PrivatePropertyHint._40_8_ +
                 (anonymous_namespace)::PrivatePropertyHint._32_8_);
      local_c0 = (bool)(anonymous_namespace)::PrivatePropertyHint[0x40];
      local_b8.val.val = (bool)(anonymous_namespace)::PrivatePropertyHint[0x48];
      local_b8.set = (bool)(anonymous_namespace)::PrivatePropertyHint[0x49];
      local_b0._M_p = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,(anonymous_namespace)::PrivatePropertyHint._80_8_,
                 (anonymous_namespace)::PrivatePropertyHint._88_8_ +
                 (anonymous_namespace)::PrivatePropertyHint._80_8_);
      local_90 = (bool)(anonymous_namespace)::PrivatePropertyHint[0x70];
      local_88 = true;
      bVar5 = this->SupportsVariableType != true;
      if (bVar5) {
        local_80._M_p = (pointer)&local_70;
        local_70._M_allocated_capacity = 0;
        local_70._8_8_ = 0;
        local_60._0_1_ = false;
        local_60._1_7_ = 0;
        local_78 = 0;
      }
      else {
        local_80._M_p = (pointer)&local_70;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"collection","");
      }
      local_60._0_1_ = !bVar5;
      peVar2 = (psVar4->
               super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_58._M_p = local_48;
      pcVar3 = (peVar2->Value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar3,pcVar3 + (peVar2->Value)._M_string_length);
      local_38.val = ((psVar4->
                      super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->Id;
      std::vector<dap::Variable,_std::allocator<dap::Variable>_>::emplace_back<dap::Variable>
                (toBeReturned,(Variable *)local_190);
      dap::Variable::~Variable((Variable *)local_190);
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar1);
  }
  std::vector<dap::Variable,_std::allocator<dap::Variable>_>::~vector(&local_1a8);
  return;
}

Assistant:

void cmDebuggerVariables::EnumerateSubVariablesIfAny(
  dap::array<dap::Variable>& toBeReturned) const
{
  dap::array<dap::Variable> ret;
  for (auto const& variables : SubVariables) {
    toBeReturned.emplace_back(dap::Variable{
      {},
      {},
      {},
      variables->GetName(),
      {},
      PrivatePropertyHint,
      SupportsVariableType ? "collection" : dap::optional<dap::string>(),
      variables->GetValue(),
      variables->GetId() });
  }
}